

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArchiveProxy.cpp
# Opt level: O0

bool __thiscall aeron::archive::ArchiveProxy::offer(ArchiveProxy *this,int32_t length)

{
  element_type *this_00;
  uint64_t uVar1;
  ArchiveException *pAVar2;
  char *pcVar3;
  allocator local_199;
  string local_198;
  allocator local_171;
  string local_170;
  allocator local_149;
  string local_148;
  undefined1 local_122;
  allocator local_121;
  string local_120;
  allocator local_f9;
  string local_f8;
  allocator local_d1;
  string local_d0;
  undefined1 local_aa;
  allocator local_a9;
  string local_a8;
  allocator local_81;
  string local_80;
  allocator local_49;
  string local_48;
  int64_t local_28;
  int64_t result;
  int32_t attempts;
  int32_t length_local;
  ArchiveProxy *this_local;
  
  result._0_4_ = this->retryAttempts_;
  result._4_4_ = length;
  _attempts = this;
  while( true ) {
    this_00 = std::
              __shared_ptr_access<aeron::ExclusivePublication,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<aeron::ExclusivePublication,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)this);
    uVar1 = io::aeron::archive::codecs::MessageHeader::encodedLength();
    local_28 = ExclusivePublication::offer(this_00,&this->buffer_,0,(int)uVar1 + result._4_4_);
    if (0 < local_28) {
      return true;
    }
    if (local_28 == -4) {
      local_aa = 1;
      pAVar2 = (ArchiveException *)__cxa_allocate_exception(0x48);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_48,"connection to the archive has been closed",&local_49);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_80,"bool aeron::archive::ArchiveProxy::offer(std::int32_t)",
                 &local_81);
      pcVar3 = aeron::util::past_prefix
                         ("/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client"
                          ,
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client/src/ArchiveProxy.cpp"
                         );
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_a8,pcVar3,&local_a9);
      ArchiveException::ArchiveException(pAVar2,&local_48,&local_80,&local_a8,0x110);
      local_aa = 0;
      __cxa_throw(pAVar2,&ArchiveException::typeinfo,ArchiveException::~ArchiveException);
    }
    if (local_28 == -1) {
      local_122 = 1;
      pAVar2 = (ArchiveException *)__cxa_allocate_exception(0x48);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_d0,"connection to the archive is no longer available",&local_d1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_f8,"bool aeron::archive::ArchiveProxy::offer(std::int32_t)",
                 &local_f9);
      pcVar3 = aeron::util::past_prefix
                         ("/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client"
                          ,
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client/src/ArchiveProxy.cpp"
                         );
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_120,pcVar3,&local_121);
      ArchiveException::ArchiveException(pAVar2,&local_d0,&local_f8,&local_120,0x112);
      local_122 = 0;
      __cxa_throw(pAVar2,&ArchiveException::typeinfo,ArchiveException::~ArchiveException);
    }
    if (local_28 == -5) break;
    result._0_4_ = (int)result + -1;
    if ((int)result < 1) {
      return false;
    }
    concurrent::YieldingIdleStrategy::idle((YieldingIdleStrategy *)&this->field_0x10);
  }
  pAVar2 = (ArchiveException *)__cxa_allocate_exception(0x48);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_148,"offer failed due to max position being reached",&local_149);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_170,"bool aeron::archive::ArchiveProxy::offer(std::int32_t)",
             &local_171);
  pcVar3 = aeron::util::past_prefix
                     ("/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client/src/ArchiveProxy.cpp"
                     );
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_198,pcVar3,&local_199);
  ArchiveException::ArchiveException(pAVar2,&local_148,&local_170,&local_198,0x114);
  __cxa_throw(pAVar2,&ArchiveException::typeinfo,ArchiveException::~ArchiveException);
}

Assistant:

bool ArchiveProxy::offer(std::int32_t length) {
    std::int32_t attempts = retryAttempts_;
    while (true) {
        std::int64_t result = publication_->offer(buffer_, 0, codecs::MessageHeader::encodedLength() + length);
        if (result > 0) {
            return true;
        }

        if (result == aeron::PUBLICATION_CLOSED) {
            throw ArchiveException("connection to the archive has been closed", SOURCEINFO);
        } else if (result == aeron::NOT_CONNECTED) {
            throw ArchiveException("connection to the archive is no longer available", SOURCEINFO);
        } else if (result == aeron::MAX_POSITION_EXCEEDED) {
            throw ArchiveException("offer failed due to max position being reached", SOURCEINFO);
        }

        if (--attempts <= 0) {
            return false;
        }

        idle_.idle();
    }
}